

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeAsyncIteratorPrototype
               (DynamicObject *asyncIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  DeferredTypeHandlerBase::Convert(typeHandler,asyncIteratorPrototype,mode,1,0);
  AddFunctionToLibraryObjectWithName
            ((((asyncIteratorPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr,
             asyncIteratorPrototype,0x11,0x2c1,
             (FunctionInfo *)JavascriptIterator::EntryInfo::SymbolIterator,0);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncIteratorPrototype(DynamicObject* asyncIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncIteratorPrototype, mode, 1);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = asyncIteratorPrototype->GetLibrary();

        library->AddFunctionToLibraryObjectWithName(asyncIteratorPrototype, PropertyIds::_symbolAsyncIterator, PropertyIds::_RuntimeFunctionNameId_asyncIterator,
            &JavascriptIterator::EntryInfo::SymbolIterator, 0);

        return true;
    }